

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O0

bool __thiscall IntBounds::HasBounds(IntBounds *this)

{
  bool local_11;
  IntBounds *this_local;
  
  local_11 = true;
  if ((this->constantLowerBound == -0x80000000) &&
     (local_11 = true, this->constantUpperBound == 0x7fffffff)) {
    local_11 = RequiresIntBoundedValueInfo(this);
  }
  return local_11;
}

Assistant:

bool IntBounds::HasBounds() const
{
    return constantLowerBound != IntConstMin || constantUpperBound != IntConstMax || RequiresIntBoundedValueInfo();
}